

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

wchar_t convert_vanilla_res_level(wchar_t i)

{
  undefined4 local_10;
  wchar_t result;
  wchar_t i_local;
  
  if (i == L'\x7fffffff') {
    local_10 = L'\x04';
  }
  else if (i == L'\x7ffffffe') {
    local_10 = L'\x05';
  }
  else if (i == L'\x7ffffffd') {
    local_10 = L'\x06';
  }
  else if (i < L'\x03') {
    if (i < L'\x01') {
      if ((uint)i < 0x80000000) {
        local_10 = L'\0';
      }
      else {
        local_10 = L'\x02';
      }
    }
    else {
      local_10 = L'\x01';
    }
  }
  else {
    local_10 = L'\x03';
  }
  return local_10;
}

Assistant:

static int convert_vanilla_res_level(int i)
{
	int result;

	if (i == UI_ENTRY_UNKNOWN_VALUE) {
		result = 4;
	} else if (i == UI_ENTRY_VALUE_NOT_PRESENT) {
		result = 5;
	} else if (i == UI_ENTRY_RESIST0_RES_VUL) {
		result = 6;
	} else if (i >= 3) {
		result = 3;
	} else if (i >= 1) {
		result = 1;
	} else if (i <= -1) {
		result = 2;
	} else {
		result = 0;
	}
	return result;
}